

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O3

void __thiscall QMdiSubWindowPrivate::removeButtonsFromMenuBar(QMdiSubWindowPrivate *this)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  bool bVar3;
  ViewMode VVar4;
  QMdiArea *this_00;
  QMainWindow *this_01;
  QMenuBar *menuBar;
  QWidget *pQVar5;
  
  pDVar1 = (this->controlContainer).wp.d;
  if (((pDVar1 != (Data *)0x0) &&
      (pQVar5 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8, *(int *)(pDVar1 + 4) != 0)) &&
     ((this->controlContainer).wp.value != (QObject *)0x0)) {
    this_00 = QMdiSubWindow::mdiArea((QMdiSubWindow *)pQVar5);
    if ((this_00 != (QMdiArea *)0x0) && (VVar4 = QMdiArea::viewMode(this_00), VVar4 == TabbedView))
    {
      return;
    }
    QWidget::window(pQVar5);
    this_01 = (QMainWindow *)QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
    if (this_01 == (QMainWindow *)0x0) {
      menuBar = (QMenuBar *)0x0;
    }
    else {
      QMainWindow::menuWidget(this_01);
      menuBar = (QMenuBar *)QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
    }
    this->ignoreWindowTitleChange = true;
    QMdi::ControlContainer::removeButtonsFromMenuBar
              ((ControlContainer *)(this->controlContainer).wp.value,menuBar);
    this->ignoreWindowTitleChange = false;
    pQVar5 = QWidget::window(pQVar5);
    QObject::removeEventFilter(&pQVar5->super_QObject);
    pDVar1 = (this->baseWidget).wp.d;
    if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
       (((this->baseWidget).wp.value != (QObject *)0x0 &&
        (bVar3 = drawTitleBarWhenMaximized(this), !bVar3)))) {
      QWidget::setWindowModified(pQVar5,false);
    }
    if ((this->originalTitle).d.ptr != (char16_t *)0x0) {
      pQVar2 = &((this->originalTitle).d.d)->super_QArrayData;
      (this->originalTitle).d.d = (Data *)0x0;
      (this->originalTitle).d.ptr = (char16_t *)0x0;
      (this->originalTitle).d.size = 0;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

bool isNull() const noexcept { return d == nullptr || d->strongref.loadRelaxed() == 0 || value == nullptr; }